

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *in_RDI;
  int i;
  string kTestsuites;
  TestResult *in_stack_00000428;
  ostream *in_stack_00000430;
  int in_stack_fffffffffffffbec;
  UnitTest *in_stack_fffffffffffffbf0;
  TestResult *in_stack_fffffffffffffbf8;
  int *in_stack_fffffffffffffc18;
  allocator<char> *in_stack_fffffffffffffc20;
  char *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  TestResult *result;
  string *in_stack_fffffffffffffcc8;
  string *value;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  string *in_stack_fffffffffffffcd8;
  string *element_name;
  ostream *in_stack_fffffffffffffce0;
  int local_2d8;
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [32];
  string local_288 [16];
  TimeInMillis in_stack_fffffffffffffd88;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [32];
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [32];
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [24];
  undefined8 in_stack_fffffffffffffe98;
  undefined1 local_159 [37];
  int local_134;
  string local_130 [39];
  ostream local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [36];
  int local_94;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [8];
  TestSuite *in_stack_ffffffffffffffd8;
  ostream *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  std::allocator<char>::~allocator(&local_31);
  std::operator<<((ostream *)in_RDI,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar3 = std::operator<<((ostream *)in_RDI,"<");
  std::operator<<(poVar3,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  local_94 = UnitTest::reportable_test_count((UnitTest *)0x236f02);
  StreamableToString<int>(in_stack_fffffffffffffc18);
  OutputXmlAttribute(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  local_e4 = UnitTest::failed_test_count((UnitTest *)0x236fce);
  StreamableToString<int>(in_stack_fffffffffffffc18);
  OutputXmlAttribute(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  poVar3 = &local_109;
  element_name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  iVar2 = UnitTest::reportable_disabled_test_count((UnitTest *)0x23709a);
  local_134 = iVar2;
  StreamableToString<int>(in_stack_fffffffffffffc18);
  OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  value = (string *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  result = (TestResult *)&local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),value);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  UnitTest::elapsed_time((UnitTest *)0x237237);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffd88);
  OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),value);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  UnitTest::start_timestamp((UnitTest *)0x2372f6);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffe98);
  OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),value);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    UnitTest::random_seed((UnitTest *)0x2373c5);
    StreamableToString<int>(in_stack_fffffffffffffc18);
    OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),value
                      );
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
  }
  UnitTest::ad_hoc_test_result((UnitTest *)0x2377a0);
  TestPropertiesAsXmlAttributes_abi_cxx11_(result);
  std::operator<<((ostream *)in_RDI,local_288);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc28
             ,in_stack_fffffffffffffc20);
  OutputXmlAttribute(poVar3,element_name,(string *)CONCAT44(iVar2,in_stack_fffffffffffffcd0),value);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::operator<<((ostream *)in_RDI,">\n");
  for (local_2d8 = 0; iVar2 = UnitTest::total_test_suite_count((UnitTest *)0x2378da),
      local_2d8 < iVar2; local_2d8 = local_2d8 + 1) {
    UnitTest::GetTestSuite(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
    iVar2 = TestSuite::reportable_test_count((TestSuite *)0x237915);
    if (0 < iVar2) {
      UnitTest::GetTestSuite(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      PrintXmlTestSuite(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  UnitTest::ad_hoc_test_result((UnitTest *)0x237a2a);
  bVar1 = TestResult::Failed(in_stack_fffffffffffffbf8);
  if (bVar1) {
    UnitTest::ad_hoc_test_result((UnitTest *)0x237a65);
    OutputXmlTestSuiteForTestResult(in_stack_00000430,in_stack_00000428);
  }
  poVar3 = std::operator<<((ostream *)in_RDI,"</");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0)
      PrintXmlTestSuite(stream, *unit_test.GetTestSuite(i));
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputXmlTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "</" << kTestsuites << ">\n";
}